

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_q8_K_ref(float *x,block_q8_K *y,int64_t k)

{
  int j;
  long lVar1;
  uint uVar2;
  int8_t *piVar3;
  long lVar4;
  short sVar5;
  long lVar6;
  int8_t *piVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  lVar6 = 0;
  lVar8 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar8 = lVar6;
  }
  piVar7 = y->qs;
  for (; lVar6 != lVar8; lVar6 = lVar6 + 1) {
    fVar10 = 0.0;
    fVar9 = 0.0;
    for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
      fVar11 = ABS(x[lVar1]);
      fVar10 = (float)(~-(uint)(fVar9 < fVar11) & (uint)fVar10 |
                      (uint)x[lVar1] & -(uint)(fVar9 < fVar11));
      if (fVar11 <= fVar9) {
        fVar11 = fVar9;
      }
      fVar9 = fVar11;
    }
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
        uVar2 = (uint)(x[lVar1] * (-127.0 / fVar10) + 12582912.0) & 0x7fffff;
        if (0x40007e < uVar2) {
          uVar2 = 0x40007f;
        }
        piVar7[lVar1] = (int8_t)uVar2;
      }
      piVar3 = piVar7;
      for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
        sVar5 = 0;
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          sVar5 = sVar5 + piVar3[lVar4];
        }
        y[lVar6].bsums[lVar1] = sVar5;
        piVar3 = piVar3 + 0x10;
      }
      y[lVar6].d = 1.0 / (-127.0 / fVar10);
    }
    else {
      memset(y + lVar6,0,0x104);
    }
    x = x + 0x100;
    piVar7 = piVar7 + 0x124;
  }
  return;
}

Assistant:

void quantize_row_q8_K_ref(const float * GGML_RESTRICT x, block_q8_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        float max = 0;
        float amax = 0;
        for (int j = 0; j < QK_K; ++j) {
            float ax = fabsf(x[j]);
            if (ax > amax) {
                amax = ax; max = x[j];
            }
        }
        if (!amax) {
            y[i].d = 0;
            memset(y[i].qs, 0, QK_K);
            x += QK_K;
            continue;
        }
        //const float iscale = -128.f/max;
        // We need this change for IQ2_XXS, else the AVX implementation becomes very awkward
        const float iscale = -127.f/max;
        for (int j = 0; j < QK_K; ++j) {
            int v = nearest_int(iscale*x[j]);
            y[i].qs[j] = MIN(127, v);
        }
        for (int j = 0; j < QK_K/16; ++j) {
            int sum = 0;
            for (int ii = 0; ii < 16; ++ii) {
                sum += y[i].qs[j*16 + ii];
            }
            y[i].bsums[j] = sum;
        }
        y[i].d = 1/iscale;
        x += QK_K;
    }
}